

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

bool igSelectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 size)

{
  bool bVar1;
  ImVec2 local_8;
  
  local_8 = size;
  bVar1 = ImGui::Selectable(label,selected,flags,&local_8);
  return bVar1;
}

Assistant:

CIMGUI_API int _igSelectable (char *larg1, int larg2, ImGuiSelectableFlags *larg3, ImVec2 const *larg4) {
  int lresult = (int)0 ;
  char *arg1 = (char *) 0 ;
  bool arg2 ;
  ImGuiSelectableFlags arg3 ;
  ImVec2 arg4 ;
  bool result;
  
  arg1 = larg1;
  arg2 = (bool)larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  try {
    result = (bool)igSelectable((char const *)arg1,arg2,arg3,arg4);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}